

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_derivative.cpp
# Opt level: O2

AffineSpace3fa * __thiscall
embree::motion_derivative_regression_test::random_quaternion_decomposition
          (AffineSpace3fa *__return_storage_ptr__,motion_derivative_regression_test *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  float fVar16;
  float local_28;
  float local_24;
  float local_20;
  
  fVar1 = rand01(this);
  fVar2 = rand01(this);
  fVar3 = rand01(this);
  random_axis((motion_derivative_regression_test *)&local_28);
  fVar4 = rand01(this);
  fVar4 = (fVar4 * 12.566371 + -6.2831855) * 0.5;
  fVar5 = cosf(fVar4);
  fVar4 = sinf(fVar4);
  fVar14 = local_28 * local_28 + local_24 * local_24 + local_20 * local_20;
  auVar15 = rsqrtss(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14));
  fVar6 = auVar15._0_4_;
  fVar16 = fVar6 * 1.5 - fVar6 * fVar6 * fVar14 * 0.5 * fVar6;
  fVar14 = rand01(this);
  fVar6 = rand01(this);
  fVar7 = rand01(this);
  fVar8 = random_scale(this);
  fVar9 = random_scale(this);
  fVar10 = random_scale(this);
  fVar11 = rand01(this);
  fVar12 = rand01(this);
  fVar13 = rand01(this);
  (__return_storage_ptr__->l).vx.field_0.m128[0] = fVar8;
  (__return_storage_ptr__->l).vx.field_0.m128[1] = fVar1 * 20.0 + -10.0;
  (__return_storage_ptr__->l).vx.field_0.m128[2] = fVar2 * 20.0 + -10.0;
  (__return_storage_ptr__->l).vx.field_0.m128[3] = local_28 * fVar16 * fVar4;
  (__return_storage_ptr__->l).vy.field_0.m128[0] = fVar11 + fVar11 + -1.0;
  (__return_storage_ptr__->l).vy.field_0.m128[1] = fVar9;
  (__return_storage_ptr__->l).vy.field_0.m128[2] = fVar3 * 20.0 + -10.0;
  (__return_storage_ptr__->l).vy.field_0.m128[3] = local_24 * fVar16 * fVar4;
  (__return_storage_ptr__->l).vz.field_0.m128[0] = fVar12 + fVar12 + -1.0;
  (__return_storage_ptr__->l).vz.field_0.m128[1] = fVar13 + fVar13 + -1.0;
  (__return_storage_ptr__->l).vz.field_0.m128[2] = fVar10;
  (__return_storage_ptr__->l).vz.field_0.m128[3] = fVar16 * local_20 * fVar4;
  (__return_storage_ptr__->p).field_0.m128[0] = fVar14 * 20.0 + -10.0;
  (__return_storage_ptr__->p).field_0.m128[1] = fVar6 * 20.0 + -10.0;
  (__return_storage_ptr__->p).field_0.m128[2] = fVar7 * 20.0 + -10.0;
  (__return_storage_ptr__->p).field_0.m128[3] = fVar5;
  return __return_storage_ptr__;
}

Assistant:

inline AffineSpace3fa random_quaternion_decomposition()
    {
      Vec3fa T(20.f * rand01() - 10.f, 20.f * rand01() - 10.f, 20.f * rand01() - 10.f);
      Quaternion3f q = Quaternion3f::rotate(random_axis(), 4.f * M_PI * rand01() - 2.f * M_PI);
      AffineSpace3fa S(one);
      S.p = Vec3fa(20.f * rand01() - 10.f, 20.f * rand01() - 10.f, 20.f * rand01() - 10.f);
      S.l.vx.x = random_scale();
      S.l.vy.y = random_scale();
      S.l.vz.z = random_scale();
      S.l.vy.x = 2.f * rand01() - 1.f;
      S.l.vz.x = 2.f * rand01() - 1.f;
      S.l.vz.y = 2.f * rand01() - 1.f;
      return quaternionDecomposition(T, q, S);
    }